

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastpackwithoutmask23_16(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1;
  uVar2 = in[1];
  *out = uVar2 << 0x17 | uVar1;
  uVar2 = uVar2 >> 9;
  out[1] = uVar2;
  uVar1 = in[2];
  out[1] = uVar1 << 0xe | uVar2;
  uVar1 = uVar1 >> 0x12;
  out[2] = uVar1;
  uVar1 = in[3] << 5 | uVar1;
  out[2] = uVar1;
  uVar2 = in[4];
  out[2] = uVar2 << 0x1c | uVar1;
  uVar2 = uVar2 >> 4;
  out[3] = uVar2;
  uVar1 = in[5];
  out[3] = uVar1 << 0x13 | uVar2;
  uVar1 = uVar1 >> 0xd;
  out[4] = uVar1;
  uVar2 = in[6];
  out[4] = uVar2 << 10 | uVar1;
  uVar2 = uVar2 >> 0x16;
  out[5] = uVar2;
  uVar2 = in[7] * 2 | uVar2;
  out[5] = uVar2;
  uVar1 = in[8];
  out[5] = uVar1 << 0x18 | uVar2;
  uVar1 = uVar1 >> 8;
  out[6] = uVar1;
  uVar2 = in[9];
  out[6] = uVar2 << 0xf | uVar1;
  uVar2 = uVar2 >> 0x11;
  out[7] = uVar2;
  uVar2 = in[10] << 6 | uVar2;
  out[7] = uVar2;
  uVar1 = in[0xb];
  out[7] = uVar1 << 0x1d | uVar2;
  uVar1 = uVar1 >> 3;
  out[8] = uVar1;
  uVar2 = in[0xc];
  out[8] = uVar2 << 0x14 | uVar1;
  uVar2 = uVar2 >> 0xc;
  out[9] = uVar2;
  uVar1 = in[0xd];
  out[9] = uVar1 << 0xb | uVar2;
  uVar1 = uVar1 >> 0x15;
  out[10] = uVar1;
  uVar1 = in[0xe] << 2 | uVar1;
  out[10] = uVar1;
  uVar2 = in[0xf];
  out[10] = uVar2 << 0x19 | uVar1;
  out[0xb] = uVar2 >> 7;
  return out + 0xc;
}

Assistant:

uint32_t *__fastpackwithoutmask23_16(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 23;
  ++out;
  *out = ((*in)) >> (23 - 14);
  ++in;
  *out |= ((*in)) << 14;
  ++out;
  *out = ((*in)) >> (23 - 5);
  ++in;
  *out |= ((*in)) << 5;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (23 - 19);
  ++in;
  *out |= ((*in)) << 19;
  ++out;
  *out = ((*in)) >> (23 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++out;
  *out = ((*in)) >> (23 - 1);
  ++in;
  *out |= ((*in)) << 1;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (23 - 15);
  ++in;
  *out |= ((*in)) << 15;
  ++out;
  *out = ((*in)) >> (23 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 29;
  ++out;
  *out = ((*in)) >> (23 - 20);
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (23 - 11);
  ++in;
  *out |= ((*in)) << 11;
  ++out;
  *out = ((*in)) >> (23 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 25;
  ++out;
  *out = ((*in)) >> (23 - 16);
  ++in;

  return out + 1;
}